

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

int __thiscall rw::StreamFile::open(StreamFile *this,char *__file,int __oflag,...)

{
  FILE *pFVar1;
  char *pcVar2;
  Error local_30;
  Error _e;
  char *mode_local;
  char *path_local;
  StreamFile *this_local;
  
  _e = ___oflag;
  pFVar1 = fopen(__file,(char *)___oflag);
  this->file = (FILE *)pFVar1;
  this_local = this;
  if (this->file == (FILE *)0x0) {
    local_30.plugin = 0;
    local_30.code = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/base.cpp",
            0x3ec);
    pFVar1 = _stderr;
    pcVar2 = dbgsprint(0x80000003,__file);
    fprintf(pFVar1,"%s\n",pcVar2);
    setError(&local_30);
    this_local = (StreamFile *)0x0;
  }
  return (int)this_local;
}

Assistant:

StreamFile*
StreamFile::open(const char *path, const char *mode)
{
	assert(this->file == nil);
	this->file = fopen(path, mode);
	if(this->file == nil){
		RWERROR((ERR_FILE, path));
		return nil;
	}
	return this;
}